

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivar.c
# Opt level: O3

void object_setIvar(id object,Ivar ivar,id value)

{
  ptrdiff_t pVar1;
  id_conflict *addr;
  
  pVar1 = ivar_getOffset(ivar);
  addr = (id_conflict *)((long)&object->isa + pVar1);
  switch(ivar->flags & 3) {
  default:
    *addr = (id_conflict)value;
    return;
  case 1:
    objc_storeStrong(addr,(id_conflict)value);
    return;
  case 2:
    objc_storeWeak(addr,(id_conflict)value);
    return;
  }
}

Assistant:

void object_setIvar(id object, Ivar ivar, id value)
{
	id *addr = (id*)((char*)object + ivar_getOffset(ivar));
	switch (ivarGetOwnership(ivar))
	{
		case ownership_strong:
			objc_storeStrong(addr, value);
			break;
		case ownership_weak:
			objc_storeWeak(addr, value);
			break;
		case ownership_unsafe:
		case ownership_invalid:
			*addr = value;
			break;
	}
}